

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep_io.c
# Opt level: O3

int SPRKStepSetUseCompensatedSums(void *arkode_mem,int onoff)

{
  int iVar1;
  int iVar2;
  ARKodeSPRKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeSPRKStepMem local_20;
  ARKodeMem local_18;
  
  local_18 = (ARKodeMem)0x0;
  local_20 = (ARKodeSPRKStepMem)0x0;
  iVar1 = sprkStep_AccessARKODEStepMem
                    (arkode_mem,"SPRKStepSetUseCompensatedSums",&local_18,&local_20);
  if (iVar1 == 0) {
    if (onoff == 0) {
      local_18->use_compensated_sums = 0;
      local_18->step = sprkStep_TakeStep;
      iVar1 = 0;
    }
    else {
      local_18->use_compensated_sums = 1;
      local_18->step = sprkStep_TakeStep_Compensated;
      iVar1 = 0;
      if (local_20->yerr == (N_Vector)0x0) {
        iVar2 = arkAllocVec(local_18,local_18->yn,&local_20->yerr);
        if (iVar2 == 0) {
          iVar1 = -0x14;
        }
        else {
          N_VConst(0,local_20->yerr);
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int SPRKStepSetUseCompensatedSums(void* arkode_mem, sunbooleantype onoff)
{
  ARKodeMem ark_mem          = NULL;
  ARKodeSPRKStepMem step_mem = NULL;
  int retval                 = 0;

  /* access ARKodeMem and ARKodeSPRKStepMem structures */
  retval = sprkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem,
                                        &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  if (onoff)
  {
    ark_mem->use_compensated_sums = SUNTRUE;
    ark_mem->step                 = sprkStep_TakeStep_Compensated;
    if (!step_mem->yerr)
    {
      if (!arkAllocVec(ark_mem, ark_mem->yn, &(step_mem->yerr)))
      {
        return ARK_MEM_FAIL;
      }
      /* Zero yerr for compensated summation */
      N_VConst(ZERO, step_mem->yerr);
    }
  }
  else
  {
    ark_mem->use_compensated_sums = SUNFALSE;
    ark_mem->step                 = sprkStep_TakeStep;
  }

  return (retval);
}